

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

CurveGeometry * embree::sse2::createCurves(Device *device,GType gtype)

{
  CurveGeometry *this;
  undefined **ppuVar1;
  undefined8 *puVar2;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  switch(gtype) {
  case GTY_BASIS_BEZIER:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_BASIS_BEZIER);
    ppuVar1 = &PTR__CurveGeometry_02204730;
    break;
  case GTY_ROUND_BEZIER_CURVE:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_ROUND_BEZIER_CURVE);
    ppuVar1 = &PTR__CurveGeometry_022044f0;
    break;
  case GTY_ORIENTED_BEZIER_CURVE:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_ORIENTED_BEZIER_CURVE);
    ppuVar1 = &PTR__CurveGeometry_02204958;
    break;
  default:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"invalid geometry type","");
    *puVar2 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar2 + 1) = 3;
    puVar2[2] = puVar2 + 4;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 2),local_40,local_40 + local_38);
    __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  case GTY_BASIS_BSPLINE:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_BASIS_BSPLINE);
    ppuVar1 = &PTR__CurveGeometry_02204dc0;
    break;
  case GTY_ROUND_BSPLINE_CURVE:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_ROUND_BSPLINE_CURVE);
    ppuVar1 = &PTR__CurveGeometry_02204b80;
    break;
  case GTY_ORIENTED_BSPLINE_CURVE:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_ORIENTED_BSPLINE_CURVE);
    ppuVar1 = &PTR__CurveGeometry_02204fe8;
    break;
  case GTY_BASIS_HERMITE:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_BASIS_HERMITE);
    ppuVar1 = &PTR__CurveGeometry_02205450;
    break;
  case GTY_ROUND_HERMITE_CURVE:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_ROUND_HERMITE_CURVE);
    ppuVar1 = &PTR__CurveGeometry_02205210;
    break;
  case GTY_ORIENTED_HERMITE_CURVE:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_ORIENTED_HERMITE_CURVE);
    ppuVar1 = &PTR__CurveGeometry_02205678;
    break;
  case GTY_BASIS_CATMULL_ROM:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_BASIS_CATMULL_ROM);
    ppuVar1 = &PTR__CurveGeometry_02205ae0;
    break;
  case GTY_ROUND_CATMULL_ROM_CURVE:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_ROUND_CATMULL_ROM_CURVE);
    ppuVar1 = &PTR__CurveGeometry_022058a0;
    break;
  case GTY_ORIENTED_CATMULL_ROM_CURVE:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_ORIENTED_CATMULL_ROM_CURVE);
    ppuVar1 = &PTR__CurveGeometry_02205d08;
  }
  (this->super_Geometry).super_RefCount._vptr_RefCount = (_func_int **)ppuVar1;
  return this;
}

Assistant:

CurveGeometry* createCurves(Device* device, Geometry::GType gtype)
    {
      switch (gtype) {
      case Geometry::GTY_ROUND_BEZIER_CURVE: return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ROUND_CURVE,CurveGeometryInterface,BezierCurveT>(device,gtype);
      case Geometry::GTY_FLAT_BEZIER_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_FLAT_CURVE,CurveGeometryInterface,BezierCurveT>(device,gtype);
      case Geometry::GTY_ORIENTED_BEZIER_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ORIENTED_CURVE,CurveGeometryInterface,BezierCurveT>(device,gtype);
        
      case Geometry::GTY_ROUND_BSPLINE_CURVE: return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ROUND_CURVE,CurveGeometryInterface,BSplineCurveT>(device,gtype);
      case Geometry::GTY_FLAT_BSPLINE_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_FLAT_CURVE,CurveGeometryInterface,BSplineCurveT>(device,gtype);
      case Geometry::GTY_ORIENTED_BSPLINE_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ORIENTED_CURVE,CurveGeometryInterface,BSplineCurveT>(device,gtype);

      case Geometry::GTY_ROUND_HERMITE_CURVE: return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ROUND_CURVE,HermiteCurveGeometryInterface,HermiteCurveT>(device,gtype);
      case Geometry::GTY_FLAT_HERMITE_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_FLAT_CURVE,HermiteCurveGeometryInterface,HermiteCurveT>(device,gtype);
      case Geometry::GTY_ORIENTED_HERMITE_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ORIENTED_CURVE,HermiteCurveGeometryInterface,HermiteCurveT>(device,gtype);

      case Geometry::GTY_ROUND_CATMULL_ROM_CURVE: return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ROUND_CURVE,CurveGeometryInterface,CatmullRomCurveT>(device,gtype);
      case Geometry::GTY_FLAT_CATMULL_ROM_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_FLAT_CURVE,CurveGeometryInterface,CatmullRomCurveT>(device,gtype);
      case Geometry::GTY_ORIENTED_CATMULL_ROM_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ORIENTED_CURVE,CurveGeometryInterface,CatmullRomCurveT>(device,gtype);
     
      default: throw_RTCError(RTC_ERROR_INVALID_OPERATION,"invalid geometry type");
      }
    }